

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsBool helicsInputGetBoolean(HelicsInput inp,HelicsError *err)

{
  bool bVar1;
  InputObject *pIVar2;
  bool boolval;
  InputObject *inpObj;
  Input *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  uint local_4;
  
  pIVar2 = anon_unknown.dwarf_5d1c2::verifyInput
                     ((HelicsInput)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                      (HelicsError *)in_stack_ffffffffffffffd0);
  if (pIVar2 == (InputObject *)0x0) {
    local_4 = 0;
  }
  else {
    bVar1 = helics::Input::getValue<bool>(in_stack_ffffffffffffffd0);
    local_4 = (uint)bVar1;
  }
  return local_4;
}

Assistant:

HelicsBool helicsInputGetBoolean(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        const bool boolval = inpObj->inputPtr->getValue<bool>();
        return (boolval) ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}